

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O3

void __thiscall
slang::driver::SourceLoader::addSearchDirectories(SourceLoader *this,string_view pattern)

{
  path *path;
  string_view pattern_00;
  error_code ec_00;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> directories;
  error_code *in_stack_ffffffffffffff20;
  uint local_d8 [2];
  error_category *local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  path local_b8;
  SmallVectorBase<std::filesystem::__cxx11::path> local_90;
  
  pattern_00._M_len = pattern._M_str;
  local_90.data_ = (pointer)local_90.firstElement;
  local_90.len = 0;
  local_90.cap = 2;
  local_d8[0] = 0;
  local_c8._M_len = pattern._M_len;
  local_c8._M_str = pattern_00._M_len;
  local_d0 = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path(&local_b8);
  pattern_00._M_str = (char *)0x1;
  svGlob((slang *)&local_b8,(path *)pattern._M_len,pattern_00,(GlobMode)&local_90,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(local_d8,0),
         in_stack_ffffffffffffff20);
  std::filesystem::__cxx11::path::~path(&local_b8);
  if (local_d8[0] == 0) {
    path = (this->searchDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    _M_range_insert<std::filesystem::__cxx11::path*>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchDirectories,path,local_90.data_,local_90.data_ + local_90.len);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_b8,&local_c8,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = local_d8[0];
    path = &local_b8;
    ec_00._M_cat = local_d0;
    addError(this,path,ec_00);
    std::filesystem::__cxx11::path::~path(&local_b8);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup(&local_90,(EVP_PKEY_CTX *)path);
  return;
}

Assistant:

void SourceLoader::addSearchDirectories(std::string_view pattern) {
    SmallVector<fs::path> directories;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, directories, /* expandEnvVars */ false, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    searchDirectories.insert(searchDirectories.end(), directories.begin(), directories.end());
}